

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTExecutionInfo.cpp
# Opt level: O3

void __thiscall
TTD::ExecutionInfoManager::PopCallEventException
          (ExecutionInfoManager *this,JavascriptFunction *function)

{
  int64 topLevelETime;
  SingleCallCounter *pSVar1;
  long lVar2;
  SingleCallCounter *pSVar3;
  byte bVar4;
  SingleCallCounter local_68;
  
  bVar4 = 0;
  if (((this->m_lastReturnLocation).m_lastFrame.Function == (FunctionBody *)0x0) ||
     (((this->m_lastReturnLocation).m_isExceptionFrame & 1U) == 0)) {
    pSVar1 = JsUtil::
             List<TTD::SingleCallCounter,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             ::Last(&this->m_callStack);
    (this->m_lastReturnLocation).m_isExceptionFrame = true;
    pSVar3 = &(this->m_lastReturnLocation).m_lastFrame;
    for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
      pSVar3->Function = pSVar1->Function;
      pSVar1 = (SingleCallCounter *)((long)pSVar1 + (ulong)bVar4 * -0x10 + 8);
      pSVar3 = (SingleCallCounter *)((long)pSVar3 + (ulong)bVar4 * -0x10 + 8);
    }
  }
  if (this->m_lastExceptionPropagating == false) {
    topLevelETime = this->m_topLevelCallbackEventTime;
    pSVar1 = JsUtil::
             List<TTD::SingleCallCounter,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             ::Last(&this->m_callStack);
    TTDebuggerSourceLocation::SetLocationFromFrame
              (&this->m_lastExceptionLocation,topLevelETime,pSVar1);
    this->m_lastExceptionPropagating = true;
  }
  this->m_runningFunctionTimeCtr = this->m_runningFunctionTimeCtr + 1;
  JsUtil::
  List<TTD::SingleCallCounter,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  ::RemoveAtEnd(&local_68,&this->m_callStack);
  return;
}

Assistant:

void ExecutionInfoManager::PopCallEventException(Js::JavascriptFunction* function)
    {
        //If we already have the last return as an exception then just leave it.
        //That is where the exception was first rasied, this return is just propagating it in this return.

        if(!this->m_lastReturnLocation.IsExceptionLocation())
        {
            this->m_lastReturnLocation.SetExceptionLocation(this->m_callStack.Last());
        }

        if(!this->m_lastExceptionPropagating)
        {
            this->m_lastExceptionLocation.SetLocationFromFrame(this->m_topLevelCallbackEventTime, this->m_callStack.Last());
            this->m_lastExceptionPropagating = true;
        }

        this->m_runningFunctionTimeCtr++;
        this->m_callStack.RemoveAtEnd();

#if ENABLE_BASIC_TRACE || ENABLE_FULL_BC_TRACE
        this->m_diagnosticLogger.WriteReturnException(function, function->GetFunctionBody()->GetScriptContext()->GetThreadContext()->TTDLog->GetLastEventTime());
#endif
    }